

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)268959744>(Recycler *this)

{
  CollectionState CVar1;
  code *pcVar2;
  bool bVar3;
  int in_EAX;
  undefined4 *puVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  
  if ((this->collectionState).value != CollectionStateNotCollecting) {
    if (((this->enableConcurrentMark == false) && (this->enableParallelMark == false)) &&
       (this->enableConcurrentSweep == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x11fe,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
      in_EAX = (int)CONCAT71(extraout_var,bVar3);
      if (!bVar3) goto LAB_00727b4a;
      *puVar4 = 0;
    }
    if (((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x11ff,"(IsConcurrentState())","IsConcurrentState()");
      in_EAX = (int)CONCAT71(extraout_var_00,bVar3);
      if (!bVar3) {
LAB_00727b4a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    CVar1 = (this->collectionState).value;
    if ((CVar1 >> 0xe & 1) == 0) {
      if ((CVar1 == CollectionStateConcurrentSweep) && (DAT_015d6420 != '\0')) {
        HeapInfoManager::ZeroQueuedPages(&this->autoHeap);
        HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
      }
      (this->collectionParam).finishOnly = true;
      (this->collectionParam).flags = FinishConcurrentOnIdle;
      this->allowDispose = false;
      this->isFinishGCOnIdle = false;
      this->skipStack = false;
      this->isConcurrentGCOnIdle = false;
      in_EAX = (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[9])
                         (this->collectionWrapper,this,FinishConcurrentCollect,0,0x10080000);
    }
    if ((CVar1 >> 0xe & 1) == 0) {
      return in_EAX;
    }
  }
  return 0;
}

Assistant:

BOOL
Recycler::FinishConcurrent()
{
    CompileAssert((flags & ~(CollectOverride_AllowDispose | CollectOverride_ForceFinish | CollectOverride_ForceInThread
        | CollectMode_Concurrent | CollectOverride_DisableIdleFinish | CollectOverride_BackgroundFinishMark
        | CollectOverride_SkipStack | CollectOverride_FinishConcurrentTimeout)) == 0);

    if (this->CollectionInProgress())
    {
        Assert(this->IsConcurrentEnabled());
        Assert(IsConcurrentState());

        const BOOL forceFinish = flags & CollectOverride_ForceFinish;

        if (forceFinish || !IsConcurrentExecutingState())
        {
#if ENABLE_BACKGROUND_PAGE_FREEING
            if (CONFIG_FLAG(EnableBGFreeZero))
            {
                if (this->IsConcurrentSweepState())
                {
                    // Help with the background thread to zero and flush zero pages
                    // if we are going to wait anyways.
                    autoHeap.ZeroQueuedPages();
                    autoHeap.FlushBackgroundPages();
                }
            }
#endif
#ifdef RECYCLER_TRACE
            collectionParam.finishOnly = true;
            collectionParam.flags = flags;
#endif
#if ENABLE_CONCURRENT_GC
            // If SkipStack is provided, and we're not forcing the finish (i.e we're not in concurrent executing state)
            // then, it's fine to set the skipStack flag to true, so that during the in-thread find-roots, we'll skip
            // the stack scan
            this->skipStack = ((flags & CollectOverride_SkipStack) != 0) && !forceFinish;
#if DBG
            this->isFinishGCOnIdle = (flags == FinishConcurrentOnIdleAtRoot);
#endif
#endif

            return FinishConcurrentCollectWrapped(flags);
        }
    }

    return false;
}